

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_MeleeAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  uint MeleeDamage;
  bool bVar1;
  PClass *pPVar2;
  AActor *self;
  char *__assertion;
  FSoundID local_14;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003d9046;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self != (AActor *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
        if (!bVar1) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003d9046;
        }
        goto LAB_003d8ff4;
      }
    }
    else if (self != (AActor *)0x0) goto LAB_003d9036;
    self = (AActor *)0x0;
LAB_003d8ff4:
    pPVar2 = DObject::GetClass((DObject *)self);
    MeleeDamage = pPVar2[1].SpecialInits.Count;
    DObject::GetClass((DObject *)self);
    DoAttack(self,true,false,MeleeDamage,&local_14,(PClassActor *)0x0,0.0);
    return 0;
  }
LAB_003d9036:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003d9046:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x3c2,
                "int AF_AActor_A_MeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MeleeAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	int MeleeDamage = self->GetClass()->MeleeDamage;
	FSoundID MeleeSound = self->GetClass()->MeleeSound;
	DoAttack(self, true, false, MeleeDamage, MeleeSound, NULL, 0);
	return 0;
}